

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

int SoapySDRDevice_writeSetting(SoapySDRDevice *device,char *key,char *value)

{
  undefined1 *puVar1;
  allocator local_39;
  char *value_local;
  string local_30;
  
  value_local = value;
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string((string *)&local_30,key,&local_39);
  SoapySDR::Device::writeSetting<char_const*>((Device *)device,&local_30,&value_local);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

int SoapySDRDevice_writeSetting(SoapySDRDevice *device, const char *key, const char *value)
{
    __SOAPY_SDR_C_TRY
    device->writeSetting(key, value);
    __SOAPY_SDR_C_CATCH
}